

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_5.cpp
# Opt level: O0

void __thiscall Date::increment_day(Date *this)

{
  bool bVar1;
  int iVar2;
  Month MVar3;
  Date *this_local;
  
  MVar3 = this->m;
  if (MVar3 != jan) {
    if (MVar3 == feb) {
      bVar1 = is_leap(this->y);
      if (bVar1) {
        iVar2 = next_val(0x1d,this->d);
        this->d = iVar2;
      }
      else {
        iVar2 = next_val(0x1c,this->d);
        this->d = iVar2;
      }
      goto LAB_00102b03;
    }
    if ((((MVar3 != mar) && (MVar3 != may)) && (1 < MVar3 - jul)) &&
       ((MVar3 != oct && (MVar3 != dec)))) {
      iVar2 = next_val(0x1e,this->d);
      this->d = iVar2;
      goto LAB_00102b03;
    }
  }
  iVar2 = next_val(0x1f,this->d);
  this->d = iVar2;
LAB_00102b03:
  if (this->d == 1) {
    MVar3 = next_val(0xc,this->m);
    this->m = MVar3;
    if (this->m == jan) {
      this->y = this->y + 1;
    }
  }
  return;
}

Assistant:

void Date::increment_day()
{
	switch (m)
	{
	case Month::feb:
	{
		if (is_leap(y))
			d = next_val(29, d);
		else
			d = next_val(28, d);
		break;
	}
	case Month::jan:
	case Month::mar:
	case Month::may:
	case Month::jul:
	case Month::aug:
	case Month::oct:
	case Month::dec:
		d = next_val(31, d);
		break;
	default:
		d = next_val(30, d);
	}

	// handles case when next day is the first day of next month
	if (d == 1)
	{
		m = Month(next_val(12, int(m)));
		if (m == Month::jan)
			++y;
	}
}